

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_helpers.cc
# Opt level: O0

int google::protobuf::compiler::java::GetExperimentalJavaFieldType(FieldDescriptor *field)

{
  bool bVar1;
  uint uVar2;
  Type TVar3;
  JavaType JVar4;
  int iVar5;
  ulong uVar6;
  Descriptor *type;
  FieldDescriptor *pFVar7;
  FieldDescriptor *value;
  int extra_bits;
  FieldDescriptor *field_local;
  
  uVar2 = google::protobuf::FieldDescriptor::is_required();
  value._4_4_ = 0;
  if ((uVar2 & 1) != 0) {
    value._4_4_ = 0x100;
  }
  TVar3 = FieldDescriptor::type(field);
  if ((TVar3 == TYPE_STRING) && (bVar1 = CheckUtf8(field), bVar1)) {
    value._4_4_ = value._4_4_ | 0x200;
  }
  uVar6 = google::protobuf::FieldDescriptor::is_required();
  if ((uVar6 & 1) == 0) {
    JVar4 = GetJavaType(field);
    if (JVar4 != JAVATYPE_MESSAGE) goto LAB_003f672c;
    type = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
    bVar1 = HasRequiredFields(type);
    if (!bVar1) goto LAB_003f672c;
  }
  value._4_4_ = value._4_4_ | 0x400;
LAB_003f672c:
  bVar1 = HasHasbit(field);
  if (bVar1) {
    value._4_4_ = value._4_4_ | 0x1000;
  }
  JVar4 = GetJavaType(field);
  if ((JVar4 == JAVATYPE_ENUM) && (bVar1 = SupportUnknownEnumValue(field), !bVar1)) {
    value._4_4_ = value._4_4_ | 0x800;
  }
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    pFVar7 = MapValueField(field);
    bVar1 = SupportUnknownEnumValue(pFVar7);
    if (!bVar1) {
      google::protobuf::FieldDescriptor::message_type();
      pFVar7 = (FieldDescriptor *)google::protobuf::Descriptor::map_value();
      JVar4 = GetJavaType(pFVar7);
      if (JVar4 == JAVATYPE_ENUM) {
        value._4_4_ = value._4_4_ | 0x800;
      }
    }
    field_local._4_4_ = value._4_4_ | 0x32;
  }
  else {
    uVar6 = google::protobuf::FieldDescriptor::is_packed();
    if ((uVar6 & 1) == 0) {
      bVar1 = FieldDescriptor::is_repeated(field);
      if (bVar1) {
        uVar2 = anon_unknown_5::GetExperimentalJavaFieldTypeForRepeated(field);
        field_local._4_4_ = uVar2 | value._4_4_;
      }
      else {
        bVar1 = IsRealOneof(field);
        if (bVar1) {
          iVar5 = anon_unknown_5::GetExperimentalJavaFieldTypeForSingular(field);
          field_local._4_4_ = iVar5 + 0x33U | value._4_4_;
        }
        else {
          uVar2 = anon_unknown_5::GetExperimentalJavaFieldTypeForSingular(field);
          field_local._4_4_ = uVar2 | value._4_4_;
        }
      }
    }
    else {
      uVar2 = anon_unknown_5::GetExperimentalJavaFieldTypeForPacked(field);
      field_local._4_4_ = uVar2 | value._4_4_;
    }
  }
  return field_local._4_4_;
}

Assistant:

int GetExperimentalJavaFieldType(const FieldDescriptor* field) {
  static const int kMapFieldType = 50;
  static const int kOneofFieldTypeOffset = 51;

  static const int kRequiredBit = 0x100;
  static const int kUtf8CheckBit = 0x200;
  static const int kCheckInitialized = 0x400;
  static const int kLegacyEnumIsClosedBit = 0x800;
  static const int kHasHasBit = 0x1000;
  int extra_bits = field->is_required() ? kRequiredBit : 0;
  if (field->type() == FieldDescriptor::TYPE_STRING && CheckUtf8(field)) {
    extra_bits |= kUtf8CheckBit;
  }
  if (field->is_required() || (GetJavaType(field) == JAVATYPE_MESSAGE &&
                               HasRequiredFields(field->message_type()))) {
    extra_bits |= kCheckInitialized;
  }
  if (HasHasbit(field)) {
    extra_bits |= kHasHasBit;
  }
  if (GetJavaType(field) == JAVATYPE_ENUM && !SupportUnknownEnumValue(field)) {
    extra_bits |= kLegacyEnumIsClosedBit;
  }

  if (field->is_map()) {
    if (!SupportUnknownEnumValue(MapValueField(field))) {
      const FieldDescriptor* value = field->message_type()->map_value();
      if (GetJavaType(value) == JAVATYPE_ENUM) {
        extra_bits |= kLegacyEnumIsClosedBit;
      }
    }
    return kMapFieldType | extra_bits;
  } else if (field->is_packed()) {
    return GetExperimentalJavaFieldTypeForPacked(field) | extra_bits;
  } else if (field->is_repeated()) {
    return GetExperimentalJavaFieldTypeForRepeated(field) | extra_bits;
  } else if (IsRealOneof(field)) {
    return (GetExperimentalJavaFieldTypeForSingular(field) +
            kOneofFieldTypeOffset) |
           extra_bits;
  } else {
    return GetExperimentalJavaFieldTypeForSingular(field) | extra_bits;
  }
}